

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O3

ErrorOr<std::unique_ptr<llvm::WriteThroughMemoryBuffer,_std::default_delete<llvm::WriteThroughMemoryBuffer>_>_>
* getReadWriteFile(ErrorOr<std::unique_ptr<llvm::WriteThroughMemoryBuffer,_std::default_delete<llvm::WriteThroughMemoryBuffer>_>_>
                   *__return_storage_ptr__,Twine *Filename,uint64_t FileSize,uint64_t MapSize,
                  uint64_t Offset)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  char *pcVar4;
  ErrorOr<std::unique_ptr<llvm::WriteThroughMemoryBuffer,_std::default_delete<llvm::WriteThroughMemoryBuffer>_>_>
  *pEVar5;
  error_code eVar6;
  int FD;
  error_code EC;
  file_status Status;
  int local_98;
  int local_94;
  error_code local_90;
  uint64_t local_80;
  file_status local_78;
  
  eVar6 = llvm::sys::fs::openFile(Filename,&local_98,CD_OpenExisting,FA_Write|FA_Read,F_None,0x1b6);
  local_90._M_cat = eVar6._M_cat;
  local_90._M_value = eVar6._M_value;
  if (local_90._M_value == 0) {
    if ((MapSize == 0xffffffffffffffff) && (MapSize = FileSize, FileSize == 0xffffffffffffffff)) {
      local_78.super_basic_file_status.fs_st_size._0_4_ = 0;
      local_78.super_basic_file_status.fs_st_size._4_4_ = 0;
      local_78.super_basic_file_status.Type = status_error;
      local_78.super_basic_file_status.fs_st_atime_nsec = 0;
      local_78.super_basic_file_status.fs_st_mtime_nsec = 0;
      local_78.super_basic_file_status.fs_st_uid = 0;
      local_78.super_basic_file_status.fs_st_gid = 0;
      local_78.super_basic_file_status.fs_st_atime = 0;
      local_78.super_basic_file_status.fs_st_mtime = 0;
      local_78.super_basic_file_status.Perms = perms_not_known;
      local_78.fs_st_dev = 0;
      local_78.fs_st_nlinks = 0;
      local_78.fs_st_ino = 0;
      eVar6 = llvm::sys::fs::status(local_98,&local_78);
      if (eVar6._M_value != 0) goto LAB_00120332;
      if ((local_78.super_basic_file_status.Type != block_file) &&
         (local_78.super_basic_file_status.Type != regular_file)) {
        pEVar5 = (ErrorOr<std::unique_ptr<llvm::WriteThroughMemoryBuffer,_std::default_delete<llvm::WriteThroughMemoryBuffer>_>_>
                  *)std::_V2::generic_category();
        __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 | 1;
        *(undefined4 *)&__return_storage_ptr__->field_0 = 0x16;
        *(ErrorOr<std::unique_ptr<llvm::WriteThroughMemoryBuffer,_std::default_delete<llvm::WriteThroughMemoryBuffer>_>_>
          **)((long)&__return_storage_ptr__->field_0 + 8) = pEVar5;
        return pEVar5;
      }
      MapSize = CONCAT44(local_78.super_basic_file_status.fs_st_size._4_4_,
                         (undefined4)local_78.super_basic_file_status.fs_st_size);
      if ((local_78.super_basic_file_status.Type != regular_file) &&
         (local_78.super_basic_file_status.Type != block_file)) {
        return (ErrorOr<std::unique_ptr<llvm::WriteThroughMemoryBuffer,_std::default_delete<llvm::WriteThroughMemoryBuffer>_>_>
                *)(ulong)local_78.super_basic_file_status.Type;
      }
    }
    plVar3 = (long *)operator_new(0x30,(NamedBufferAlloc *)Filename);
    local_94 = local_98;
    *plVar3 = (long)&PTR__MemoryBufferMMapFile_00183fd8;
    iVar1 = llvm::sys::fs::mapped_file_region::alignment();
    iVar2 = llvm::sys::fs::mapped_file_region::alignment();
    local_80 = Offset;
    llvm::sys::fs::mapped_file_region::mapped_file_region
              ((mapped_file_region *)(plVar3 + 3),local_94,readwrite,
               ((long)(iVar1 + -1) & Offset) + MapSize,(long)-iVar2 & Offset,&local_90);
    if (local_90._M_value == 0) {
      pcVar4 = llvm::sys::fs::mapped_file_region::const_data((mapped_file_region *)(plVar3 + 3));
      iVar1 = llvm::sys::fs::mapped_file_region::alignment();
      plVar3[1] = (long)(pcVar4 + ((long)(iVar1 + -1) & local_80));
      plVar3[2] = (long)(pcVar4 + ((long)(iVar1 + -1) & local_80) + MapSize);
      if (local_90._M_value == 0) {
        __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 & 0xfe;
        *(long **)&__return_storage_ptr__->field_0 = plVar3;
        return (ErrorOr<std::unique_ptr<llvm::WriteThroughMemoryBuffer,_std::default_delete<llvm::WriteThroughMemoryBuffer>_>_>
                *)(ulong)(uint)local_90._M_value;
      }
    }
    __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 | 1;
    *(int *)&__return_storage_ptr__->field_0 = local_90._M_value;
    *(error_category **)((long)&__return_storage_ptr__->field_0 + 8) = local_90._M_cat;
    pEVar5 = (ErrorOr<std::unique_ptr<llvm::WriteThroughMemoryBuffer,_std::default_delete<llvm::WriteThroughMemoryBuffer>_>_>
              *)(**(code **)(*plVar3 + 8))(plVar3);
  }
  else {
LAB_00120332:
    pEVar5 = eVar6._0_8_;
    __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 | 1;
    *(int *)&__return_storage_ptr__->field_0 = eVar6._M_value;
    *(error_category **)((long)&__return_storage_ptr__->field_0 + 8) = eVar6._M_cat;
  }
  return pEVar5;
}

Assistant:

static ErrorOr<std::unique_ptr<WriteThroughMemoryBuffer>>
getReadWriteFile(const Twine &Filename, uint64_t FileSize, uint64_t MapSize,
                 uint64_t Offset) {
  int FD;
  std::error_code EC = sys::fs::openFileForReadWrite(
      Filename, FD, sys::fs::CD_OpenExisting, sys::fs::OF_None);

  if (EC)
    return EC;

  // Default is to map the full file.
  if (MapSize == uint64_t(-1)) {
    // If we don't know the file size, use fstat to find out.  fstat on an open
    // file descriptor is cheaper than stat on a random path.
    if (FileSize == uint64_t(-1)) {
      sys::fs::file_status Status;
      std::error_code EC = sys::fs::status(FD, Status);
      if (EC)
        return EC;

      // If this not a file or a block device (e.g. it's a named pipe
      // or character device), we can't mmap it, so error out.
      sys::fs::file_type Type = Status.type();
      if (Type != sys::fs::file_type::regular_file &&
          Type != sys::fs::file_type::block_file)
        return make_error_code(errc::invalid_argument);

      FileSize = Status.getSize();
    }
    MapSize = FileSize;
  }

  std::unique_ptr<WriteThroughMemoryBuffer> Result(
      new (NamedBufferAlloc(Filename))
          MemoryBufferMMapFile<WriteThroughMemoryBuffer>(false, FD, MapSize,
                                                         Offset, EC));
  if (EC)
    return EC;
  return std::move(Result);
}